

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O1

int __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
executeThreads(MicrothreadManager<implementations::scheme::SchemeImplementation> *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  bool bVar3;
  long *plVar4;
  _threads_iterator thread;
  uint uVar5;
  bool bVar6;
  
  thread._M_node = (this->threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->threads)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)thread._M_node == p_Var1) {
    bVar6 = false;
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    bVar6 = false;
    do {
      plVar4 = (long *)(*(code *)**(undefined8 **)thread._M_node[1]._M_right)();
      cVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
      if (cVar2 == '\0') {
        bVar3 = isThreadScheduled(this,thread);
        if (bVar3) {
          bVar3 = executeThread(this,thread);
          uVar5 = uVar5 + bVar3;
          if (*(char *)((long)&thread._M_node[1]._M_left + 4) == '\0') {
            plVar4 = (long *)(*(code *)**(undefined8 **)thread._M_node[1]._M_right)();
            cVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
            if (cVar2 != '\0') {
              bVar6 = true;
            }
          }
        }
      }
      else if (*(char *)((long)&thread._M_node[1]._M_left + 4) == '\0') {
        bVar6 = true;
      }
      thread._M_node = (_Base_ptr)std::_Rb_tree_increment(thread._M_node);
    } while ((_Rb_tree_header *)thread._M_node != p_Var1);
  }
  if (bVar6) {
    (**this->_vptr_MicrothreadManager)(this);
  }
  (*this->_vptr_MicrothreadManager[1])(this,(ulong)bVar6,(ulong)uVar5);
  return uVar5;
}

Assistant:

int executeThreads() {
				int threads_run = 0;
				bool unwatched_resolved = false;
				for (auto it = threads.begin(); it != threads.end(); ++it) {
					if (it->second.isResolved()) {
						if(it->second.watched == false)
							unwatched_resolved = true;
						continue;
					}
					if (isThreadScheduled(it) == false) {
						continue;
					}
					if(executeThread(it))
						++threads_run;
					if (it->second.watched == false && it->second.isResolved())
						unwatched_resolved = true;
				}
				if(unwatched_resolved)
					idle();
				yield_process(unwatched_resolved, threads_run);
				return threads_run;
			}